

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mspec.c
# Opt level: O3

void apet_walk_to_room(CHAR_DATA *ch,int vnum)

{
  ROOM_INDEX_DATA *pRVar1;
  ROOM_INDEX_DATA *pRVar2;
  CHAR_DATA *pCVar3;
  ROOM_INDEX_DATA *pRVar4;
  int in_ESI;
  CHAR_DATA *in_RDI;
  char *__end;
  int local_74;
  char_data *local_70;
  string local_68;
  string local_48;
  
  pRVar4 = get_room_index(0);
  pRVar1 = in_RDI->in_room;
  if (pRVar1 != pRVar4) {
    walk_to_room(in_RDI,pRVar4);
    pRVar4 = in_RDI->in_room;
    pRVar2 = in_RDI->leader->in_room;
    if (pRVar4 == pRVar1 || pRVar4 != pRVar2) {
      if (pRVar4 != pRVar2) {
        char_from_room(in_RDI);
        char_to_room(in_RDI,in_RDI->leader->in_room);
      }
      do_say(in_RDI,
             "I can\'t seem to lead us over there from here.  Try heading back to another part of town?"
            );
      pCVar3 = in_RDI->leader;
      pCVar3->master = in_RDI;
      in_RDI->master = pCVar3;
    }
    else {
      WAIT_STATE(in_RDI->leader,0xc);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"apet_walk_to_room","");
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"apet_walk_to_room","");
      CQueue::AddToQueue<void(*)(char_data*,int),char_data*&,int&>
                (&RS.Queue,2,&local_48,&local_68,apet_walk_to_room,&local_70,&local_74);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    return;
  }
  apet_at_room(in_RDI,in_ESI);
  return;
}

Assistant:

void apet_walk_to_room(CHAR_DATA *ch, int vnum)
{
	ROOM_INDEX_DATA *room = get_room_index(vnum), *oldroom = ch->in_room;

	if (ch->in_room == room)
	{
		apet_at_room(ch, vnum);
		return;
	}

	walk_to_room(ch, room);

	if (ch->in_room == oldroom || ch->in_room != ch->leader->in_room)
	{
		if (ch->in_room != ch->leader->in_room)
		{
			char_from_room(ch);
			char_to_room(ch, ch->leader->in_room);
		}

		do_say(ch, "I can't seem to lead us over there from here.  Try heading back to another part of town?");

		ch->leader->master = ch;
		ch->master = ch->leader;
		return;
	}

	WAIT_STATE(ch->leader, PULSE_VIOLENCE);

	RS.Queue.AddToQueue(2, "apet_walk_to_room", "apet_walk_to_room", apet_walk_to_room, ch, vnum);
}